

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedBodyInertia.cpp
# Opt level: O0

ArticulatedBodyInertia *
iDynTree::ArticulatedBodyInertia::ABADyadHelper(SpatialForceVector *U,double d)

{
  VectorFixSize<3U> *pVVar1;
  Stride<0,_0> *this;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *this_00;
  long in_RSI;
  ArticulatedBodyInertia *in_RDI;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> Uang;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> Ulin;
  double inv_d;
  ArticulatedBodyInertia *ret;
  DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
  *in_stack_fffffffffffffdd8;
  ArticulatedBodyInertia *in_stack_fffffffffffffde0;
  PointerArgType in_stack_fffffffffffffde8;
  ArticulatedBodyInertia *this_01;
  StorageBaseType *in_stack_fffffffffffffe20;
  double *in_stack_fffffffffffffe28;
  
  this_01 = in_RDI;
  ArticulatedBodyInertia(in_stack_fffffffffffffde0);
  pVVar1 = &SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
                      ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RSI + 8))->super_Vector3;
  this = (Stride<0,_0> *)VectorFixSize<3U>::data(pVVar1);
  Eigen::Stride<0,_0>::Stride(this);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)in_RDI,
             in_stack_fffffffffffffde8,this);
  pVVar1 = &SpatialVector<iDynTree::SpatialForceVector>::getAngularVec3
                      ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RSI + 8))->super_Vector3;
  this_00 = (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
             *)VectorFixSize<3U>::data(pVVar1);
  Eigen::Stride<0,_0>::Stride(this);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)in_RDI,
             (PointerArgType)this_00,this);
  Eigen::operator*(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  Eigen::DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose(this_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_RDI);
  getLinearLinearSubmatrix(in_RDI);
  toEigen<3u,3u>(&this_01->linearLinear);
  Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)this,
             in_stack_fffffffffffffdd8);
  Eigen::operator*(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  Eigen::DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose(this_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_RDI);
  getLinearAngularSubmatrix(in_RDI);
  toEigen<3u,3u>(&this_01->linearLinear);
  Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)this,
             in_stack_fffffffffffffdd8);
  Eigen::operator*(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  Eigen::DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose(this_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_RDI);
  getAngularAngularSubmatrix(in_RDI);
  toEigen<3u,3u>(&this_01->linearLinear);
  Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)this,
             in_stack_fffffffffffffdd8);
  return this_01;
}

Assistant:

ArticulatedBodyInertia ArticulatedBodyInertia::ABADyadHelper(const SpatialForceVector& U, const double d)
{
    ArticulatedBodyInertia ret;

    double inv_d = 1.0/d;

    Eigen::Map<const Eigen::Vector3d> Ulin(U.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> Uang(U.getAngularVec3().data());

    toEigen(ret.getLinearLinearSubmatrix()) = (inv_d*Ulin)*Ulin.transpose();
    toEigen(ret.getLinearAngularSubmatrix()) = (inv_d*Ulin)*Uang.transpose();
    toEigen(ret.getAngularAngularSubmatrix()) = (inv_d*Uang)*Uang.transpose();

    return ret;
}